

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O1

void __thiscall
irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::createSpecialCharacterList
          (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this)

{
  array<irr::core::string<unsigned_long>_> *this_00;
  string<unsigned_long> local_28;
  
  this_00 = &this->SpecialCharacters;
  local_28.array = (unsigned_long *)0x0;
  local_28.allocated = 0;
  local_28.used = 0;
  core::string<unsigned_long>::operator=(&local_28,"&amp;");
  core::array<irr::core::string<unsigned_long>_>::push_back(this_00,&local_28);
  if (local_28.array != (unsigned_long *)0x0) {
    operator_delete__(local_28.array);
  }
  local_28.array = (unsigned_long *)0x0;
  local_28.allocated = 0;
  local_28.used = 0;
  core::string<unsigned_long>::operator=(&local_28,"<lt;");
  core::array<irr::core::string<unsigned_long>_>::push_back(this_00,&local_28);
  if (local_28.array != (unsigned_long *)0x0) {
    operator_delete__(local_28.array);
  }
  local_28.array = (unsigned_long *)0x0;
  local_28.allocated = 0;
  local_28.used = 0;
  core::string<unsigned_long>::operator=(&local_28,">gt;");
  core::array<irr::core::string<unsigned_long>_>::push_back(this_00,&local_28);
  if (local_28.array != (unsigned_long *)0x0) {
    operator_delete__(local_28.array);
  }
  local_28.array = (unsigned_long *)0x0;
  local_28.allocated = 0;
  local_28.used = 0;
  core::string<unsigned_long>::operator=(&local_28,"\"quot;");
  core::array<irr::core::string<unsigned_long>_>::push_back(this_00,&local_28);
  if (local_28.array != (unsigned_long *)0x0) {
    operator_delete__(local_28.array);
  }
  local_28.array = (unsigned_long *)0x0;
  local_28.allocated = 0;
  local_28.used = 0;
  core::string<unsigned_long>::operator=(&local_28,"\'apos;");
  core::array<irr::core::string<unsigned_long>_>::push_back(this_00,&local_28);
  if (local_28.array != (unsigned_long *)0x0) {
    operator_delete__(local_28.array);
  }
  return;
}

Assistant:

void createSpecialCharacterList()
	{
		// list of strings containing special symbols, 
		// the first character is the special character,
		// the following is the symbol string without trailing &.

		SpecialCharacters.push_back("&amp;");
		SpecialCharacters.push_back("<lt;");
		SpecialCharacters.push_back(">gt;");
		SpecialCharacters.push_back("\"quot;");
		SpecialCharacters.push_back("'apos;");
		
	}